

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  RTCIntersectFunctionN p_Var26;
  byte bVar27;
  long lVar28;
  byte bVar29;
  ulong uVar30;
  uint uVar31;
  ulong *puVar32;
  undefined1 (*pauVar33) [32];
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2608[0] != 8) {
    auVar40 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar53 = ZEXT816(0) << 0x40;
    uVar35 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar53),5);
    uVar25 = vpcmpeqd_avx512vl(auVar40,(undefined1  [32])valid_i->field_0);
    uVar35 = uVar35 & uVar25;
    bVar34 = (byte)uVar35;
    if (bVar34 != 0) {
      auVar40 = *(undefined1 (*) [32])(ray + 0x80);
      auVar37 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar38 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar43._16_4_ = 0x7fffffff;
      auVar43._20_4_ = 0x7fffffff;
      auVar43._24_4_ = 0x7fffffff;
      auVar43._28_4_ = 0x7fffffff;
      auVar39 = vandps_avx(auVar40,auVar43);
      auVar46._8_4_ = 0x219392ef;
      auVar46._0_8_ = 0x219392ef219392ef;
      auVar46._12_4_ = 0x219392ef;
      auVar46._16_4_ = 0x219392ef;
      auVar46._20_4_ = 0x219392ef;
      auVar46._24_4_ = 0x219392ef;
      auVar46._28_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar39,auVar46,1);
      bVar5 = (bool)((byte)uVar25 & 1);
      auVar39._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._0_4_;
      bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._4_4_;
      bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._8_4_;
      bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._12_4_;
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._16_4_;
      bVar5 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._20_4_;
      bVar5 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._24_4_;
      bVar5 = SUB81(uVar25 >> 7,0);
      auVar39._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar40._28_4_;
      auVar40 = vandps_avx(auVar37,auVar43);
      uVar25 = vcmpps_avx512vl(auVar40,auVar46,1);
      bVar5 = (bool)((byte)uVar25 & 1);
      auVar41._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._0_4_;
      bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._4_4_;
      bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._8_4_;
      bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._12_4_;
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._16_4_;
      bVar5 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._20_4_;
      bVar5 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._24_4_;
      bVar5 = SUB81(uVar25 >> 7,0);
      auVar41._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar37._28_4_;
      auVar40 = vandps_avx(auVar38,auVar43);
      uVar25 = vcmpps_avx512vl(auVar40,auVar46,1);
      bVar5 = (bool)((byte)uVar25 & 1);
      auVar40._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._0_4_;
      bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._4_4_;
      bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._8_4_;
      bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._12_4_;
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      auVar40._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._16_4_;
      bVar5 = (bool)((byte)(uVar25 >> 5) & 1);
      auVar40._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._20_4_;
      bVar5 = (bool)((byte)(uVar25 >> 6) & 1);
      auVar40._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._24_4_;
      bVar5 = SUB81(uVar25 >> 7,0);
      auVar40._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar38._28_4_;
      auVar37 = vrcp14ps_avx512vl(auVar39);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar14 = vfnmadd213ps_fma(auVar39,auVar37,auVar44);
      auVar38 = vrcp14ps_avx512vl(auVar41);
      auVar15 = vfnmadd213ps_fma(auVar41,auVar38,auVar44);
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar16 = vfnmadd213ps_fma(auVar40,auVar39,auVar44);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar60 = ZEXT3264(local_1e80);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar53));
      local_26e0._0_4_ = (uint)(bVar34 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000
      ;
      bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
      local_26e0._4_4_ = (uint)bVar5 * auVar40._4_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar35 >> 2) & 1);
      local_26e0._8_4_ = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
      local_26e0._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar35 >> 4) & 1);
      local_26e0._16_4_ = (uint)bVar5 * auVar40._16_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar35 >> 5) & 1);
      local_26e0._20_4_ = (uint)bVar5 * auVar40._20_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar35 >> 6) & 1);
      local_26e0._24_4_ = (uint)bVar5 * auVar40._24_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = SUB81(uVar35 >> 7,0);
      local_26e0._28_4_ = (uint)bVar5 * auVar40._28_4_ | (uint)!bVar5 * 0x7f800000;
      auVar61 = ZEXT3264(local_26e0);
      auVar40 = *(undefined1 (*) [32])ray;
      auVar45._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar45._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar45._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar45._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar45._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar45._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar45._28_4_ = auVar40._28_4_ ^ 0x80000000;
      auVar40 = *(undefined1 (*) [32])(ray + 0x20);
      auVar47._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar47._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar47._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar47._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar47._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar47._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar47._28_4_ = auVar40._28_4_ ^ 0x80000000;
      bVar24 = ~bVar34;
      auVar40 = *(undefined1 (*) [32])(ray + 0x40);
      auVar42._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar42._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar42._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar42._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar42._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar42._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar42._28_4_ = auVar40._28_4_ ^ 0x80000000;
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar38,auVar38);
      auVar58 = ZEXT1664(auVar15);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar53));
      bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar35 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar35 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
      bVar11 = SUB81(uVar35 >> 7,0);
      auVar62 = ZEXT3264(CONCAT428((uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * auVar40._28_4_,
                                   CONCAT424((uint)bVar10 * auVar38._24_4_ |
                                             (uint)!bVar10 * auVar40._24_4_,
                                             CONCAT420((uint)bVar9 * auVar38._20_4_ |
                                                       (uint)!bVar9 * auVar40._20_4_,
                                                       CONCAT416((uint)bVar8 * auVar38._16_4_ |
                                                                 (uint)!bVar8 * auVar40._16_4_,
                                                                 CONCAT412((uint)bVar7 *
                                                                           auVar38._12_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar40._12_4_,
                                                                           CONCAT48((uint)bVar6 *
                                                                                    auVar38._8_4_ |
                                                                                    (uint)!bVar6 *
                                                                                    auVar40._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar5 * auVar38._4_4_ |
                                                  (uint)!bVar5 * auVar40._4_4_,
                                                  (uint)(bVar34 & 1) * auVar38._0_4_ |
                                                  (uint)!(bool)(bVar34 & 1) * auVar40._0_4_))))))));
      auVar53 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar37,auVar37);
      auVar57 = ZEXT1664(auVar53);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar39,auVar39);
      auVar59 = ZEXT1664(auVar14);
      puVar32 = local_2608 + 1;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_26e0;
      local_2680 = ZEXT1632(auVar53);
      local_2700 = vmulps_avx512vl(local_2680,auVar45);
      auVar63 = ZEXT3264(local_2700);
      local_26a0 = ZEXT1632(auVar15);
      local_2720 = vmulps_avx512vl(local_26a0,auVar47);
      auVar64 = ZEXT3264(local_2720);
      local_26c0 = ZEXT1632(auVar14);
      local_2740 = vmulps_avx512vl(local_26c0,auVar42);
      auVar65 = ZEXT3264(local_2740);
LAB_01d15502:
      uVar35 = puVar32[-1];
      if (uVar35 != 0xfffffffffffffff8) {
        puVar32 = puVar32 + -1;
        pauVar1 = pauVar33 + -1;
        pauVar33 = pauVar33 + -1;
        local_2660 = auVar62._0_32_;
        uVar12 = vcmpps_avx512vl(*pauVar1,local_2660,1);
        auVar40 = *pauVar1;
        if ((char)uVar12 != '\0') {
          do {
            uVar31 = (uint)uVar35;
            if ((uVar35 & 8) != 0) {
              if (uVar35 == 0xfffffffffffffff8) goto LAB_01d1585c;
              uVar12 = vcmpps_avx512vl(local_2660,auVar40,6);
              if ((char)uVar12 != '\0') {
                bVar29 = ~bVar24;
                lVar28 = 0;
                goto LAB_01d156f3;
              }
              break;
            }
            uVar25 = uVar35 & 0xfffffffffffffff0;
            uVar35 = 8;
            auVar37 = auVar60._0_32_;
            for (lVar28 = -0x10;
                (lVar28 != 0 && (uVar4 = *(ulong *)(uVar25 + 0x20 + lVar28 * 2), uVar4 != 8));
                lVar28 = lVar28 + 4) {
              uVar2 = *(undefined4 *)(uVar25 + 0x90 + lVar28);
              auVar50._4_4_ = uVar2;
              auVar50._0_4_ = uVar2;
              auVar50._8_4_ = uVar2;
              auVar50._12_4_ = uVar2;
              auVar50._16_4_ = uVar2;
              auVar50._20_4_ = uVar2;
              auVar50._24_4_ = uVar2;
              auVar50._28_4_ = uVar2;
              auVar38 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar2 = *(undefined4 *)(uVar25 + 0x30 + lVar28);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              auVar48._16_4_ = uVar2;
              auVar48._20_4_ = uVar2;
              auVar48._24_4_ = uVar2;
              auVar48._28_4_ = uVar2;
              auVar39 = vfmadd213ps_avx512vl(auVar50,auVar38,auVar48);
              uVar2 = *(undefined4 *)(uVar25 + 0xb0 + lVar28);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              auVar51._16_4_ = uVar2;
              auVar51._20_4_ = uVar2;
              auVar51._24_4_ = uVar2;
              auVar51._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar25 + 0x50 + lVar28);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar17._16_4_ = uVar2;
              auVar17._20_4_ = uVar2;
              auVar17._24_4_ = uVar2;
              auVar17._28_4_ = uVar2;
              auVar41 = vfmadd213ps_avx512vl(auVar51,auVar38,auVar17);
              uVar2 = *(undefined4 *)(uVar25 + 0xd0 + lVar28);
              auVar52._4_4_ = uVar2;
              auVar52._0_4_ = uVar2;
              auVar52._8_4_ = uVar2;
              auVar52._12_4_ = uVar2;
              auVar52._16_4_ = uVar2;
              auVar52._20_4_ = uVar2;
              auVar52._24_4_ = uVar2;
              auVar52._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar25 + 0x70 + lVar28);
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar18._16_4_ = uVar2;
              auVar18._20_4_ = uVar2;
              auVar18._24_4_ = uVar2;
              auVar18._28_4_ = uVar2;
              auVar42 = vfmadd213ps_avx512vl(auVar52,auVar38,auVar18);
              uVar2 = *(undefined4 *)(uVar25 + 0xa0 + lVar28);
              auVar54._4_4_ = uVar2;
              auVar54._0_4_ = uVar2;
              auVar54._8_4_ = uVar2;
              auVar54._12_4_ = uVar2;
              auVar54._16_4_ = uVar2;
              auVar54._20_4_ = uVar2;
              auVar54._24_4_ = uVar2;
              auVar54._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar25 + 0x40 + lVar28);
              auVar19._4_4_ = uVar2;
              auVar19._0_4_ = uVar2;
              auVar19._8_4_ = uVar2;
              auVar19._12_4_ = uVar2;
              auVar19._16_4_ = uVar2;
              auVar19._20_4_ = uVar2;
              auVar19._24_4_ = uVar2;
              auVar19._28_4_ = uVar2;
              auVar43 = vfmadd213ps_avx512vl(auVar54,auVar38,auVar19);
              uVar2 = *(undefined4 *)(uVar25 + 0xc0 + lVar28);
              auVar55._4_4_ = uVar2;
              auVar55._0_4_ = uVar2;
              auVar55._8_4_ = uVar2;
              auVar55._12_4_ = uVar2;
              auVar55._16_4_ = uVar2;
              auVar55._20_4_ = uVar2;
              auVar55._24_4_ = uVar2;
              auVar55._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar25 + 0x60 + lVar28);
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar20._16_4_ = uVar2;
              auVar20._20_4_ = uVar2;
              auVar20._24_4_ = uVar2;
              auVar20._28_4_ = uVar2;
              auVar44 = vfmadd213ps_avx512vl(auVar55,auVar38,auVar20);
              uVar2 = *(undefined4 *)(uVar25 + 0xe0 + lVar28);
              auVar56._4_4_ = uVar2;
              auVar56._0_4_ = uVar2;
              auVar56._8_4_ = uVar2;
              auVar56._12_4_ = uVar2;
              auVar56._16_4_ = uVar2;
              auVar56._20_4_ = uVar2;
              auVar56._24_4_ = uVar2;
              auVar56._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar25 + 0x80 + lVar28);
              auVar21._4_4_ = uVar2;
              auVar21._0_4_ = uVar2;
              auVar21._8_4_ = uVar2;
              auVar21._12_4_ = uVar2;
              auVar21._16_4_ = uVar2;
              auVar21._20_4_ = uVar2;
              auVar21._24_4_ = uVar2;
              auVar21._28_4_ = uVar2;
              auVar45 = vfmadd213ps_avx512vl(auVar56,auVar38,auVar21);
              auVar46 = vfmadd213ps_avx512vl(auVar39,auVar57._0_32_,auVar63._0_32_);
              auVar47 = vfmadd213ps_avx512vl(auVar41,auVar58._0_32_,auVar64._0_32_);
              auVar48 = vfmadd213ps_avx512vl(auVar42,auVar59._0_32_,auVar65._0_32_);
              auVar42 = vfmadd213ps_avx512vl(auVar43,auVar57._0_32_,auVar63._0_32_);
              auVar43 = vfmadd213ps_avx512vl(auVar44,auVar58._0_32_,auVar64._0_32_);
              auVar44 = vfmadd213ps_avx512vl(auVar45,auVar59._0_32_,auVar65._0_32_);
              auVar39 = vpminsd_avx2(auVar46,auVar42);
              auVar41 = vpminsd_avx2(auVar47,auVar43);
              auVar39 = vpmaxsd_avx2(auVar39,auVar41);
              auVar41 = vpminsd_avx2(auVar48,auVar44);
              auVar39 = vpmaxsd_avx2(auVar39,auVar41);
              auVar41 = vpmaxsd_avx2(auVar46,auVar42);
              auVar42 = vpmaxsd_avx2(auVar47,auVar43);
              auVar43 = vpminsd_avx2(auVar41,auVar42);
              auVar41 = vpmaxsd_avx2(auVar48,auVar44);
              auVar42 = vpmaxsd_avx2(auVar39,auVar61._0_32_);
              auVar41 = vpminsd_avx512vl(auVar41,local_2660);
              auVar41 = vpminsd_avx2(auVar43,auVar41);
              uVar36 = vcmpps_avx512vl(auVar42,auVar41,2);
              if ((uVar31 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar25 + 0xf0 + lVar28);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar22._16_4_ = uVar2;
                auVar22._20_4_ = uVar2;
                auVar22._24_4_ = uVar2;
                auVar22._28_4_ = uVar2;
                uVar30 = vcmpps_avx512vl(auVar38,auVar22,0xd);
                uVar2 = *(undefined4 *)(uVar25 + 0x100 + lVar28);
                auVar23._4_4_ = uVar2;
                auVar23._0_4_ = uVar2;
                auVar23._8_4_ = uVar2;
                auVar23._12_4_ = uVar2;
                auVar23._16_4_ = uVar2;
                auVar23._20_4_ = uVar2;
                auVar23._24_4_ = uVar2;
                auVar23._28_4_ = uVar2;
                uVar13 = vcmpps_avx512vl(auVar38,auVar23,1);
                uVar36 = uVar36 & uVar30 & uVar13;
              }
              uVar30 = vcmpps_avx512vl(local_2660,auVar40,6);
              uVar36 = uVar36 & uVar30;
              uVar30 = uVar35;
              auVar49 = auVar37;
              if ((byte)uVar36 != 0) {
                auVar39 = vblendmps_avx512vl(auVar60._0_32_,auVar39);
                bVar5 = (bool)((byte)uVar36 & 1);
                auVar49._0_4_ = (uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * auVar38._0_4_;
                bVar5 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar5 * auVar39._4_4_ | (uint)!bVar5 * auVar38._4_4_;
                bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar5 * auVar39._8_4_ | (uint)!bVar5 * auVar38._8_4_;
                bVar5 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar49._12_4_ = (uint)bVar5 * auVar39._12_4_ | (uint)!bVar5 * auVar38._12_4_;
                bVar5 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar49._16_4_ = (uint)bVar5 * auVar39._16_4_ | (uint)!bVar5 * auVar38._16_4_;
                bVar5 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar49._20_4_ = (uint)bVar5 * auVar39._20_4_ | (uint)!bVar5 * auVar38._20_4_;
                bVar5 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar49._24_4_ = (uint)bVar5 * auVar39._24_4_ | (uint)!bVar5 * auVar38._24_4_;
                bVar5 = SUB81(uVar36 >> 7,0);
                auVar49._28_4_ = (uint)bVar5 * auVar39._28_4_ | (uint)!bVar5 * auVar38._28_4_;
                uVar30 = uVar4;
                if (uVar35 != 8) {
                  *puVar32 = uVar35;
                  puVar32 = puVar32 + 1;
                  *pauVar33 = auVar37;
                  pauVar33 = pauVar33 + 1;
                }
              }
              auVar37 = auVar49;
              uVar35 = uVar30;
            }
            auVar40 = auVar37;
          } while (uVar35 != 8);
        }
        goto LAB_01d15502;
      }
LAB_01d1585c:
      bVar24 = bVar24 & bVar34;
      bVar5 = (bool)(bVar24 >> 1 & 1);
      bVar6 = (bool)(bVar24 >> 2 & 1);
      bVar7 = (bool)(bVar24 >> 3 & 1);
      bVar8 = (bool)(bVar24 >> 4 & 1);
      bVar9 = (bool)(bVar24 >> 5 & 1);
      bVar10 = (bool)(bVar24 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar24 & 1) * -0x800000 | (uint)!(bool)(bVar24 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar24 >> 7) * -0x800000 | (uint)!(bool)(bVar24 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
  while( true ) {
    local_2788.geomID = *(uint *)((uVar35 & 0xfffffffffffffff0) + lVar28 * 8);
    local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
    uVar3 = local_2758->mask;
    auVar37._4_4_ = uVar3;
    auVar37._0_4_ = uVar3;
    auVar37._8_4_ = uVar3;
    auVar37._12_4_ = uVar3;
    auVar37._16_4_ = uVar3;
    auVar37._20_4_ = uVar3;
    auVar37._24_4_ = uVar3;
    auVar37._28_4_ = uVar3;
    uVar12 = vptestmd_avx512vl(auVar37,*(undefined1 (*) [32])(ray + 0x120));
    bVar27 = (byte)uVar12 & bVar29;
    if (bVar27 == 0) {
      bVar27 = 0xff;
    }
    else {
      local_2788.primID = *(uint *)((uVar35 & 0xfffffffffffffff0) + 4 + lVar28 * 8);
      local_2640 = vpmovm2d_avx512vl((ulong)bVar27);
      local_2788.valid = (int *)local_2640;
      local_2788.geometryUserPtr = local_2758->userPtr;
      local_2788.context = context->user;
      local_2788.N = 8;
      local_2750 = 0;
      local_2748 = context->args;
      p_Var26 = local_2748->intersect;
      if (p_Var26 == (RTCIntersectFunctionN)0x0) {
        p_Var26 = (RTCIntersectFunctionN)
                  local_2758[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_2788.rayhit = (RTCRayHitN *)ray;
      (*p_Var26)(&local_2788);
      uVar12 = vcmpps_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                               *(undefined1 (*) [32])(ray + 0x100),0xe);
      bVar27 = ~(byte)uVar12;
      auVar57 = ZEXT3264(local_2680);
      auVar58 = ZEXT3264(local_26a0);
      auVar59 = ZEXT3264(local_26c0);
      auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      auVar61 = ZEXT3264(local_26e0);
      auVar62 = ZEXT3264(local_2660);
      auVar63 = ZEXT3264(local_2700);
      auVar64 = ZEXT3264(local_2720);
      auVar65 = ZEXT3264(local_2740);
    }
    auVar40 = auVar62._0_32_;
    lVar28 = lVar28 + 1;
    bVar29 = bVar29 & bVar27;
    if (bVar29 == 0) break;
LAB_01d156f3:
    auVar40 = auVar62._0_32_;
    if ((ulong)(uVar31 & 0xf) - 8 == lVar28) goto LAB_01d1582f;
  }
  bVar29 = 0;
LAB_01d1582f:
  bVar24 = bVar24 | ~bVar29;
  if (bVar24 == 0xff) {
    bVar24 = 0xff;
    goto LAB_01d1585c;
  }
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar5 = (bool)(bVar24 >> 1 & 1);
  bVar6 = (bool)(bVar24 >> 2 & 1);
  bVar7 = (bool)(bVar24 >> 3 & 1);
  bVar8 = (bool)(bVar24 >> 4 & 1);
  bVar9 = (bool)(bVar24 >> 5 & 1);
  bVar10 = (bool)(bVar24 >> 6 & 1);
  auVar62 = ZEXT3264(CONCAT428((uint)(bVar24 >> 7) * auVar37._28_4_ |
                               (uint)!(bool)(bVar24 >> 7) * auVar40._28_4_,
                               CONCAT424((uint)bVar10 * auVar37._24_4_ |
                                         (uint)!bVar10 * auVar40._24_4_,
                                         CONCAT420((uint)bVar9 * auVar37._20_4_ |
                                                   (uint)!bVar9 * auVar40._20_4_,
                                                   CONCAT416((uint)bVar8 * auVar37._16_4_ |
                                                             (uint)!bVar8 * auVar40._16_4_,
                                                             CONCAT412((uint)bVar7 * auVar37._12_4_
                                                                       | (uint)!bVar7 *
                                                                         auVar40._12_4_,
                                                                       CONCAT48((uint)bVar6 *
                                                                                auVar37._8_4_ |
                                                                                (uint)!bVar6 *
                                                                                auVar40._8_4_,
                                                                                CONCAT44((uint)bVar5
                                                                                         * auVar37.
                                                  _4_4_ | (uint)!bVar5 * auVar40._4_4_,
                                                  (uint)(bVar24 & 1) * auVar37._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * auVar40._0_4_))))))));
  goto LAB_01d15502;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }